

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionValue::parse
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details,string *text)

{
  element_type *peVar1;
  shared_ptr<const_cxxopts::OptionDetails> local_30;
  string *local_20;
  string *text_local;
  shared_ptr<const_cxxopts::OptionDetails> *details_local;
  OptionValue *this_local;
  
  local_20 = text;
  text_local = (string *)details;
  details_local = (shared_ptr<const_cxxopts::OptionDetails> *)this;
  std::shared_ptr<const_cxxopts::OptionDetails>::shared_ptr(&local_30,details);
  ensure_value(this,&local_30);
  std::shared_ptr<const_cxxopts::OptionDetails>::~shared_ptr(&local_30);
  this->m_count = this->m_count + 1;
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar1->_vptr_Value[3])(peVar1,local_20);
  return;
}

Assistant:

void
    parse
    (
      std::shared_ptr<const OptionDetails> details,
      const std::string& text
    )
    {
      ensure_value(details);
      ++m_count;
      m_value->parse(text);
    }